

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqr_test.cpp
# Opt level: O0

void __thiscall SqrTest_sampleTest_Test::TestBody(SqrTest_sampleTest_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_50;
  Message local_48 [3];
  unsigned_long_long local_30 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  SqrTest_sampleTest_Test *this_local;
  
  local_30[1] = 0x19;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  local_30[0] = sqr(5);
  testing::internal::EqHelper<false>::Compare<unsigned_long_long,unsigned_long_long>
            ((EqHelper<false> *)local_20,"25ull","sqr(5)",local_30 + 1,local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_48);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/chunmeng[P]cmake-project-base/test/sqr_test.cpp"
               ,0xc,message);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST_F(SqrTest, sampleTest)
{
    EXPECT_EQ(25ull, sqr(5));
}